

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O0

int index_accent_phrase_in_breath_group(JPCommonLabelAccentPhrase *a)

{
  JPCommonLabelAccentPhrase *index;
  int i;
  JPCommonLabelAccentPhrase *a_local;
  
  i = 0;
  for (index = a->up->head; (index != (JPCommonLabelAccentPhrase *)0x0 && (i = i + 1, index != a));
      index = index->next) {
  }
  return i;
}

Assistant:

static int index_accent_phrase_in_breath_group(JPCommonLabelAccentPhrase * a)
{
   int i;
   JPCommonLabelAccentPhrase *index;

   for (i = 0, index = a->up->head; index != NULL; index = index->next) {
      i++;
      if (index == a)
         break;
   }
   return i;
}